

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void (anonymous_namespace)::
     testScanLineImageChannel<Imath_3_2::half,(Imf_3_4::PixelType)1,unsigned_int,(Imf_3_4::PixelType)0>
               (char *fileName,int width,int height,Compression compression)

{
  uint t1;
  Compression CVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  Compression *pCVar6;
  char *pcVar7;
  half *phVar8;
  uint *puVar9;
  Compression in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  float fVar10;
  int x_1;
  int y_1;
  InputFile in;
  FrameBuffer fb_1;
  Array2D<unsigned_int> inPixels;
  OutputFile out;
  FrameBuffer fb;
  Header hdr;
  int x;
  int y;
  Array2D<Imath_3_2::half> outPixels;
  float in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffdcc;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffdd0;
  int local_1b8;
  int local_1b4;
  undefined1 local_1b0 [88];
  char local_158 [48];
  Array2D<unsigned_int> local_128;
  undefined1 local_110 [72];
  char local_c8 [52];
  Channel local_94 [28];
  Vec2<float> local_78;
  Header local_70 [56];
  int local_38;
  int local_34;
  Array2D<Imath_3_2::half> local_30;
  Compression local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_14);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,"output type ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,"input type ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
  poVar5 = std::operator<<(poVar5,":\n    ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  for (local_34 = 0; iVar2 = local_c, iVar4 = local_10, local_34 < local_10; local_34 = local_34 + 1
      ) {
    for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,(long)local_34);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 in_stack_fffffffffffffdbc);
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_78,0.0,0.0);
  Imf_3_4::Header::Header
            (local_70,iVar2,iVar4,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION);
  CVar1 = local_14;
  pCVar6 = (Compression *)Imf_3_4::Header::compression();
  *pCVar6 = CVar1;
  pcVar7 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_94,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar7,(Channel *)0x22e4ae);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x16844e);
  phVar8 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,0);
  uVar12 = 0;
  uVar11 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_110 + 0x10),HALF,(char *)phVar8,2,(long)local_c * 2,1,1,0.0,false,false
            );
  Imf_3_4::FrameBuffer::insert(local_c8,(Slice *)0x22e4ae);
  poVar5 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  pcVar7 = local_8;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)local_110,pcVar7,local_70,iVar4);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_110);
  Imf_3_4::OutputFile::writePixels((int)local_110);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_110);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x16856e);
  Imf_3_4::Header::~Header(local_70);
  Imf_3_4::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)in_stack_fffffffffffffdd0,
             CONCAT44(in_stack_fffffffffffffdcc,uVar12),CONCAT44(in_stack_fffffffffffffdc4,uVar11));
  poVar5 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1685d4);
  puVar9 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_128,0);
  uVar11 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_1b0 + 0x20),UINT,(char *)puVar9,4,(long)local_c << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(local_158,(Slice *)0x22e4ae);
  pcVar7 = local_8;
  iVar4 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)local_1b0,pcVar7,iVar4);
  Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)local_1b0);
  Imf_3_4::InputFile::readPixels((int)local_1b0,0);
  Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(in_stack_fffffffffffffdc4,uVar11));
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1686c9);
  poVar5 = std::operator<<((ostream *)&std::cout,"comparing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  local_1b4 = 0;
  do {
    if (local_10 <= local_1b4) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      remove(local_8);
      Imf_3_4::Array2D<unsigned_int>::~Array2D
                ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffdc4,uVar11));
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffdc4,uVar11));
      return;
    }
    for (local_1b8 = 0; local_1b8 < local_c; local_1b8 = local_1b8 + 1) {
      puVar9 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_128,(long)local_1b4);
      t1 = puVar9[local_1b8];
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,(long)local_1b4);
      fVar10 = Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffffdc4,uVar11));
      bVar3 = anon_unknown.dwarf_7fa20::isEquivalent<unsigned_int>(t1,(uint)(long)fVar10,local_14);
      if (!bVar3) {
        __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                      ,0xd4,
                      "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
                     );
      }
    }
    local_1b4 = local_1b4 + 1;
  } while( true );
}

Assistant:

void
testScanLineImageChannel (
    const char fileName[], int width, int height, Compression compression)
{
    cout << "scan lines, "
            "compression "
         << compression << ", "
         << "output type " << OutTypeTag << ", "
         << "input type " << InTypeTag << ":\n    " << flush;

    Array2D<OutType> outPixels (height, width);

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            outPixels[y][x] = x * 10 + y;

    {
        Header hdr (width, height);

        hdr.compression () = compression;

        hdr.channels ().insert (
            "X",                   // name
            Channel (OutTypeTag)); // type

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                OutTypeTag,                         // type
                (char*) &outPixels[0][0],           // base
                sizeof (outPixels[0][0]),           // xStride
                sizeof (outPixels[0][0]) * width)); // yStride

        cout << "writing " << flush;

        OutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        out.writePixels (height);
    }

    Array2D<InType> inPixels (height, width);

    {
        cout << "reading " << flush;

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                InTypeTag,                         // type
                (char*) &inPixels[0][0],           // base
                sizeof (inPixels[0][0]),           // xStride
                sizeof (inPixels[0][0]) * width)); // yStride

        InputFile in (fileName);
        in.setFrameBuffer (fb);
        in.readPixels (0, height - 1);
    }

    cout << "comparing" << flush;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            assert (isEquivalent (
                inPixels[y][x], InType (outPixels[y][x]), compression));
        }
    }

    cout << endl;

    remove (fileName);
}